

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_or.hpp
# Opt level: O2

void __thiscall
pstore::
error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
::move_construct<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>
          (error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
           *this,error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>
                 *rhs)

{
  error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
  eVar1;
  error_code *peVar2;
  reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_> *prVar3;
  reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_> *prVar4;
  error_code eVar5;
  
  eVar1 = (error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
           )rhs->has_error_;
  this[0x10] = eVar1;
  if (eVar1 == (error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
                )0x1) {
    peVar2 = error_storage_impl<pstore::error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>&,std::error_code>
                       ((error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
                         *)this);
    eVar5 = error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>::
            get_error(rhs);
    peVar2->_M_value = eVar5._M_value;
    peVar2->_M_cat = eVar5._M_cat;
  }
  else {
    prVar3 = value_storage_impl<pstore::error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>&,std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
                       ((error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
                         *)this);
    prVar4 = error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>::
             value_storage_impl<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>&,std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
                       (rhs);
    prVar3->_M_data = prVar4->_M_data;
  }
  return;
}

Assistant:

void error_or<T>::move_construct (error_or<Other> && rhs) noexcept {
        has_error_ = rhs.has_error_;
        if (has_error_) {
            new (get_error_storage ()) std::error_code (rhs.get_error ());
        } else {
            new (get_storage ()) storage_type (std::move (*rhs.get_storage ()));
        }
    }